

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O2

void nifti_image_free(nifti_image *nim)

{
  if (nim != (nifti_image *)0x0) {
    free(nim->fname);
    free(nim->iname);
    free(nim->data);
    nifti_free_extensions(nim);
    free(nim);
    return;
  }
  return;
}

Assistant:

void nifti_image_free( nifti_image *nim )
{
   if( nim == NULL ) return ;
   if( nim->fname != NULL ) free(nim->fname) ;
   if( nim->iname != NULL ) free(nim->iname) ;
   if( nim->data  != NULL ) free(nim->data ) ;
   (void)nifti_free_extensions( nim ) ;
   free(nim) ; return ;
}